

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeStr::ParseNodeStr(ParseNodeStr *this,charcount_t ichMin,charcount_t ichLim,IdentPtr name)

{
  IdentPtr name_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodeStr *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,knopStr,ichMin,ichLim);
  this->pid = name;
  return;
}

Assistant:

ParseNodeStr::ParseNodeStr(charcount_t ichMin, charcount_t ichLim, IdentPtr name)
    : ParseNode(knopStr, ichMin, ichLim), pid(name)
{
}